

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

mpc_parser_t * mpc_or(int n,...)

{
  char in_AL;
  mpc_parser_t *pmVar1;
  void *pvVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  ulong uVar3;
  undefined8 in_R8;
  void **ppvVar4;
  ulong uVar5;
  void **ppvVar6;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  uint local_f8;
  void *local_d8 [4];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_d8[1] = (void *)in_RSI;
  local_d8[2] = (void *)in_RDX;
  local_d8[3] = (void *)in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  pmVar1 = (mpc_parser_t *)calloc(1,0x38);
  pmVar1->name = (char *)0x0;
  pmVar1->type = '\x17';
  pmVar1->retained = '\0';
  (pmVar1->data).repeat.n = n;
  pvVar2 = malloc((long)n * 8);
  (pmVar1->data).lift.x = pvVar2;
  ppvVar4 = &va[0].overflow_arg_area;
  if (0 < n) {
    local_f8 = 8;
    uVar3 = 0;
    do {
      if (local_f8 < 0x29) {
        uVar5 = (ulong)local_f8;
        local_f8 = local_f8 + 8;
        ppvVar6 = (void **)((long)local_d8 + uVar5);
      }
      else {
        ppvVar6 = ppvVar4;
        ppvVar4 = ppvVar4 + 1;
      }
      *(void **)((long)pvVar2 + uVar3 * 8) = *ppvVar6;
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
  }
  return pmVar1;
}

Assistant:

mpc_parser_t *mpc_or(int n, ...) {

  int i;
  va_list va;

  mpc_parser_t *p = mpc_undefined();

  p->type = MPC_TYPE_OR;
  p->data.or.n = n;
  p->data.or.xs = malloc(sizeof(mpc_parser_t*) * n);

  va_start(va, n);
  for (i = 0; i < n; i++) {
    p->data.or.xs[i] = va_arg(va, mpc_parser_t*);
  }
  va_end(va);

  return p;
}